

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void init_curses_ui(void)

{
  setlocale(6,"");
  curses_scr = (SCREEN *)newterm(0,_stdout,_stdin);
  set_term(curses_scr);
  if ((0x17 < (int)_LINES) && (0x4f < (int)_COLS)) {
    noecho();
    raw();
    nonl();
    meta(basewin,1);
    leaveok(basewin,1);
    orig_cursor = curs_set(1);
    keypad(basewin,1);
    define_extra_keypad_keys();
    set_escdelay(0x14);
    init_nhcolors();
    ui_flags.playmode = 0;
    ui_flags.unicode = _nc_unicode_locale();
    basewin = _stdscr;
    return;
  }
  fprintf(_stderr,"Sorry, your terminal is too small for DynaMoHack. Current: (%x, %x)\n",
          (ulong)_COLS,(ulong)_LINES);
  endwin();
  exit(0);
}

Assistant:

void init_curses_ui(void)
{
    /* set up the default system locale by reading the environment variables */
    setlocale(LC_ALL, "");

    curses_scr = newterm(NULL, stdout, stdin);
    set_term(curses_scr);

    if (LINES < 24 || COLS < COLNO) {
	fprintf(stderr, "Sorry, your terminal is too small for DynaMoHack. Current: (%x, %x)\n", COLS, LINES);
	endwin();
	exit(0);
    }

    noecho();
    raw();
    nonl();
    meta(basewin, TRUE);
    leaveok(basewin, TRUE);
    orig_cursor = curs_set(1);
    keypad(basewin, TRUE);
    define_extra_keypad_keys();
    set_escdelay(20);

    init_nhcolors();
    ui_flags.playmode = MODE_NORMAL;
    ui_flags.unicode = _nc_unicode_locale();

    /* with PDCurses/Win32 stdscr is not NULL before newterm runs, which caused
     * crashes. So basewin is a copy of stdscr which is known to be NULL before
     * curses is inited. */
    basewin = stdscr;
}